

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::RegisterTransientMemory
          (StandardBufferManager *this,idx_t size,BlockManager *block_manager)

{
  BlockManager *pBVar1;
  BlockManager *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<duckdb::BlockHandle,_true> sVar3;
  BufferHandle buffer_handle;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  pBVar1 = (BlockManager *)BlockManager::GetBlockSize(in_RCX);
  if (block_manager < pBVar1) {
    sVar3 = RegisterSmallMemory(this,(MemoryTag)size,9);
    _Var2._M_pi = sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
  }
  else {
    Allocate(&buffer_handle,(StandardBufferManager *)size,IN_MEMORY_TABLE,in_RCX,false);
    ::std::__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2> *)&buffer_handle);
    BufferHandle::~BufferHandle(&buffer_handle);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar3.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::RegisterTransientMemory(const idx_t size, BlockManager &block_manager) {
	D_ASSERT(size <= block_manager.GetBlockSize());

	// This comparison is the reason behind passing block_size through transient memory creation.
	// Otherwise, any non-default block size would register as small memory, causing problems when
	// trying to convert that memory to consistent blocks later on.
	if (size < block_manager.GetBlockSize()) {
		return RegisterSmallMemory(MemoryTag::IN_MEMORY_TABLE, size);
	}

	auto buffer_handle = Allocate(MemoryTag::IN_MEMORY_TABLE, &block_manager, false);
	return buffer_handle.GetBlockHandle();
}